

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_tessellation_domain_origin_state
          (Impl *this,Value *state,VkPipelineTessellationDomainOriginStateCreateInfo **out_info)

{
  VkTessellationDomainOrigin VVar1;
  VkPipelineTessellationDomainOriginStateCreateInfo *pVVar2;
  Type this_00;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPipelineTessellationDomainOriginStateCreateInfo>
                     (&this->allocator);
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"domainOrigin");
  VVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->domainOrigin = VVar1;
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_tessellation_domain_origin_state(const Value &state, VkPipelineTessellationDomainOriginStateCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineTessellationDomainOriginStateCreateInfo>();
	info->domainOrigin = static_cast<VkTessellationDomainOrigin>(state["domainOrigin"].GetUint());
	*out_info = info;
	return true;
}